

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_headers.c
# Opt level: O3

int test_uchar(void)

{
  puts("\nVerifying assignment:");
  printf("b:   %d\n",0);
  printf("b2:  %d %d \n",0,1);
  printf("b4:  %d %d %d %d\n",0,1,2,3);
  printf("b8:  %d %d %d %d %d %d %d %d\n",0,1,2,3,4,5,6,7);
  printf("b16: %d %d %d %d %d %d %d %d %d %d %d %d %d %d %d %d\n",0,1,2,3,4,5,6,7,8,9,10,0xb,0xc,0xd
         ,0xe,0xf);
  puts("\nVerifying vector access:");
  puts("__cl_uchar2 SIMD vectors not supported on this architecture.");
  puts("__cl_uchar4 SIMD vectors not supported on this architecture.");
  printf("__cl_uchar8:  %d %d %d %d %d %d %d %d \n",0,1,2,3,4,5,6,7);
  printf("__cl_uchar16: %d %d %d %d %d %d %d %d %d %d %d %d %d %d %d %d \n",0,1,2,3,4,5,6,7,8,9,10,
         0xb,0xc,0xd,0xe,0xf);
  putchar(10);
  return 0;
}

Assistant:

int test_uchar(void)
{
/* uchar */
    /* Constructor */
    cl_uchar a = 0;
    cl_uchar2 a2 = {{ 0, 1 }};
    cl_uchar4 a4 = {{ 0, 1, 2, 3 }};
    cl_uchar8 a8 = {{ 0, 1, 2, 3, 4, 5, 6, 7 }};
    cl_uchar16 a16 = {{ 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 }};

    /* assignment */
    cl_uchar    b = a;
    cl_uchar2   b2 = a2;
    cl_uchar4   b4 = a4;
    cl_uchar8   b8 = a8;
    cl_uchar16  b16 = a16;

    printf("\nVerifying assignment:\n" );
    printf("b:   %d\n", b );
    printf("b2:  %d %d \n", b2.s[0], b2.s[1] );
    printf("b4:  %d %d %d %d\n", b4.s[0], b4.s[1], b4.s[2], b4.s[3] );
    printf("b8:  %d %d %d %d %d %d %d %d\n", b8.s[0], b8.s[1], b8.s[2], b8.s[3], b8.s[4], b8.s[5], b8.s[6], b8.s[7] );
    printf("b16: %d %d %d %d %d %d %d %d %d %d %d %d %d %d %d %d\n", b16.s[0], b16.s[1], b16.s[2], b16.s[3], b16.s[4], b16.s[5], b16.s[6], b16.s[7],
                                                                     b16.s[8], b16.s[9], b16.s[10], b16.s[11], b16.s[12], b16.s[13], b16.s[14], b16.s[15]);

    /* vector access */
    printf("\nVerifying vector access:\n" );
#if defined( __CL_UCHAR2__ )
    __cl_uchar2 v2 = b2.v2;
    printf("__cl_uchar2:  %d %d \n", ((uchar*)&v2)[0], ((cl_uchar*)&v2)[1] );
#else
    printf( "__cl_uchar2 SIMD vectors not supported on this architecture.\n" );
#endif

#if defined( __CL_UCHAR4__ )
    __cl_uchar4 v4 = b4.v4;
    printf("__cl_uchar4:  %d %d %d %d \n", ((uchar*)&v4)[0], ((cl_uchar*)&v4)[1], ((cl_uchar*)&v4)[2], ((cl_uchar*)&v4)[3] );
#else
    printf( "__cl_uchar4 SIMD vectors not supported on this architecture.\n" );
#endif

#if defined( __CL_UCHAR8__ )
    __cl_uchar8 v8 = b8.v8;
    printf("__cl_uchar8:  %d %d %d %d %d %d %d %d \n", ((cl_uchar*)&v8)[0], ((cl_uchar*)&v8)[1], ((cl_uchar*)&v8)[2], ((cl_uchar*)&v8)[3], ((cl_uchar*)&v8)[4], ((cl_uchar*)&v8)[5], ((cl_uchar*)&v8)[6], ((cl_uchar*)&v8)[7] );
#else
    printf( "__cl_uchar8 SIMD vectors not supported on this architecture.\n" );
#endif

#if defined( __CL_UCHAR16__ )
    __cl_uchar16 v16 = b16.v16;
    printf("__cl_uchar16: %d %d %d %d %d %d %d %d %d %d %d %d %d %d %d %d \n", ((cl_uchar*)&v16)[0], ((cl_uchar*)&v16)[1], ((cl_uchar*)&v16)[2], ((cl_uchar*)&v16)[3], ((cl_uchar*)&v16)[4], ((cl_uchar*)&v16)[5], ((cl_uchar*)&v16)[6], ((cl_uchar*)&v16)[7],
                                                                      ((cl_uchar*)&v16)[8], ((cl_uchar*)&v16)[9], ((cl_uchar*)&v16)[10], ((cl_uchar*)&v16)[11], ((cl_uchar*)&v16)[12], ((cl_uchar*)&v16)[13], ((cl_uchar*)&v16)[14], ((cl_uchar*)&v16)[15]);
#else
    printf( "__cl_uchar16 SIMD vectors not supported on this architecture.\n" );
#endif

    printf( "\n" );
    return 0;
}